

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

char * cmState::GetTargetTypeName(TargetType targetType)

{
  char *pcStack_10;
  TargetType targetType_local;
  
  switch(targetType) {
  case EXECUTABLE:
    pcStack_10 = "EXECUTABLE";
    break;
  case STATIC_LIBRARY:
    pcStack_10 = "STATIC_LIBRARY";
    break;
  case SHARED_LIBRARY:
    pcStack_10 = "SHARED_LIBRARY";
    break;
  case MODULE_LIBRARY:
    pcStack_10 = "MODULE_LIBRARY";
    break;
  case OBJECT_LIBRARY:
    pcStack_10 = "OBJECT_LIBRARY";
    break;
  case UTILITY:
    pcStack_10 = "UTILITY";
    break;
  case GLOBAL_TARGET:
    pcStack_10 = "GLOBAL_TARGET";
    break;
  case INTERFACE_LIBRARY:
    pcStack_10 = "INTERFACE_LIBRARY";
    break;
  case UNKNOWN_LIBRARY:
    pcStack_10 = "UNKNOWN_LIBRARY";
    break;
  default:
    __assert_fail("false && \"Unexpected target type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmState.cxx"
                  ,0x41,"static const char *cmState::GetTargetTypeName(cmStateEnums::TargetType)");
  }
  return pcStack_10;
}

Assistant:

const char* cmState::GetTargetTypeName(cmStateEnums::TargetType targetType)
{
  switch (targetType) {
    case cmStateEnums::STATIC_LIBRARY:
      return "STATIC_LIBRARY";
    case cmStateEnums::MODULE_LIBRARY:
      return "MODULE_LIBRARY";
    case cmStateEnums::SHARED_LIBRARY:
      return "SHARED_LIBRARY";
    case cmStateEnums::OBJECT_LIBRARY:
      return "OBJECT_LIBRARY";
    case cmStateEnums::EXECUTABLE:
      return "EXECUTABLE";
    case cmStateEnums::UTILITY:
      return "UTILITY";
    case cmStateEnums::GLOBAL_TARGET:
      return "GLOBAL_TARGET";
    case cmStateEnums::INTERFACE_LIBRARY:
      return "INTERFACE_LIBRARY";
    case cmStateEnums::UNKNOWN_LIBRARY:
      return "UNKNOWN_LIBRARY";
  }
  assert(false && "Unexpected target type");
  return CM_NULLPTR;
}